

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<int>_>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Animatable<int>_> *this,Animatable<int> *fallback)

{
  Animatable<int> *fallback_local;
  TypedAttributeWithFallback<tinyusdz::Animatable<int>_> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&this->_paths);
  nonstd::optional_lite::optional<tinyusdz::Animatable<int>_>::optional(&this->_attrib);
  this->_empty = false;
  Animatable<int>::Animatable(&this->_fallback,fallback);
  this->_blocked = false;
  return;
}

Assistant:

TypedAttributeWithFallback(const T &fallback) : _fallback(fallback) {}